

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

uint __thiscall
PFunction::AddVariant
          (PFunction *this,PPrototype *proto,TArray<unsigned_int,_unsigned_int> *argflags,
          VMFunction *impl)

{
  uint uVar1;
  undefined1 local_40 [8];
  Variant variant;
  VMFunction *impl_local;
  TArray<unsigned_int,_unsigned_int> *argflags_local;
  PPrototype *proto_local;
  PFunction *this_local;
  
  variant.ArgFlags._8_8_ = impl;
  Variant::Variant((Variant *)local_40);
  TArray<unsigned_int,_unsigned_int>::operator=
            ((TArray<unsigned_int,_unsigned_int> *)&variant,argflags);
  local_40._0_4_ = variant.ArgFlags.Most;
  local_40._4_4_ = variant.ArgFlags.Count;
  *(PPrototype **)(variant.ArgFlags._8_8_ + 0x30) = proto;
  uVar1 = TArray<PFunction::Variant,_PFunction::Variant>::Push(&this->Variants,(Variant *)local_40);
  Variant::~Variant((Variant *)local_40);
  return uVar1;
}

Assistant:

unsigned PFunction::AddVariant(PPrototype *proto, TArray<DWORD> &argflags, VMFunction *impl)
{
	Variant variant;

	//variant.Proto = proto;
	variant.ArgFlags = argflags;
	variant.Implementation = impl;
	impl->Proto = proto;
	return Variants.Push(variant);
}